

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

WaitForkStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WaitForkStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          Token *args_4)

{
  Token wait;
  Token fork;
  Token semi;
  WaitForkStatementSyntax *this_00;
  Token *args_local_4;
  Token *args_local_3;
  Token *args_local_2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local_1;
  NamedLabelSyntax **args_local;
  BumpAllocator *this_local;
  
  this_00 = (WaitForkStatementSyntax *)allocate(this,0x78,8);
  wait.kind = args_2->kind;
  wait._2_1_ = args_2->field_0x2;
  wait.numFlags.raw = (args_2->numFlags).raw;
  wait.rawLen = args_2->rawLen;
  wait.info = args_2->info;
  fork.kind = args_3->kind;
  fork._2_1_ = args_3->field_0x2;
  fork.numFlags.raw = (args_3->numFlags).raw;
  fork.rawLen = args_3->rawLen;
  fork.info = args_3->info;
  semi.kind = args_4->kind;
  semi._2_1_ = args_4->field_0x2;
  semi.numFlags.raw = (args_4->numFlags).raw;
  semi.rawLen = args_4->rawLen;
  semi.info = args_4->info;
  slang::syntax::WaitForkStatementSyntax::WaitForkStatementSyntax
            (this_00,*args,args_1,wait,fork,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }